

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

void __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<absl::lts_20250127::status_internal::StatusRep::ToString[abi:cxx11](absl::lts_20250127::StatusToStringMode)const::__0,void,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&>
          (functional_internal *this,VoidPtr ptr,type args,type args_1)

{
  bool bVar1;
  Cord *this_00;
  Cord *pCVar2;
  strings_internal *this_01;
  string_view src;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  string local_e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c8;
  bool local_a8;
  string local_a0;
  undefined1 local_80 [32];
  ulong local_60;
  char *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  undefined8 local_40;
  char *local_38;
  
  this_00 = (Cord *)args._M_str;
  local_a8 = false;
  pCVar2 = this_00;
  if ((code *)**(undefined8 **)this == (code *)0x0) {
    this_01 = *(strings_internal **)(this + 8);
  }
  else {
    (*(code *)**(undefined8 **)this)(local_80,ptr.obj,args._M_len);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_80);
    if (local_60._0_1_ == true) {
      local_60 = local_60 & 0xffffffffffffff00;
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
    }
    this_01 = *(strings_internal **)(this + 8);
    if ((local_a8 & 1U) != 0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      bVar1 = true;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_c8._M_value._M_dataplus._M_p,
                 (pointer)(local_c8._M_value._M_string_length +
                          (long)local_c8._M_value._M_dataplus._M_p));
      goto LAB_00323b80;
    }
  }
  Cord::operator_cast_to_string(&local_a0,this_00);
  src._M_str = (char *)pCVar2;
  src._M_len = (size_t)local_a0._M_dataplus._M_p;
  CHexEscape_abi_cxx11_(&local_e8,(lts_20250127 *)local_a0._M_string_length,src);
  bVar1 = false;
LAB_00323b80:
  local_80._0_8_ = (pointer)0x2;
  local_80._8_8_ = (long)"EXTERNAL [" + 8;
  local_60 = 2;
  local_58 = "=\'";
  local_50 = local_e8._M_string_length;
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e8._M_dataplus._M_p;
  local_40 = 2;
  local_38 = "\']";
  pieces._M_len = local_e8._M_string_length;
  pieces._M_array = (iterator)0x5;
  local_80._16_8_ = ptr;
  local_80._24_8_ = args._M_len;
  strings_internal::AppendPieces(this_01,(Nonnull<std::string_*>)local_80,pieces);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 == true) {
    local_a8 = false;
    if (local_c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c8._M_value + 0x10)) {
      operator_delete((void *)local_c8._M_value._M_dataplus._M_p,local_c8._16_8_ + 1);
    }
  }
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}